

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

PortConnectionSyntax * __thiscall slang::parsing::Parser::parsePortConnection(Parser *this)

{
  Token openParen_00;
  Token closeParen_00;
  bool bVar1;
  PropertyExprSyntax *expr_00;
  Token TVar2;
  Token name_00;
  Token TVar3;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_1e8;
  undefined1 local_1b8 [16];
  Info *local_1a8;
  Token local_1a0;
  Token local_190;
  Token local_180;
  pointer local_170;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_168;
  Token local_138;
  Token local_128;
  undefined1 local_118 [8];
  Token closeParen;
  Token openParen;
  PropertyExprSyntax *expr;
  Token name;
  Token dot;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_b0;
  Token local_80;
  pointer local_70;
  pointer local_68;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_60;
  undefined1 local_30 [8];
  AttrList attributes;
  Parser *this_local;
  
  attributes.size_ = (size_type)this;
  _local_30 = parseAttributes(this);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
  if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis), bVar1)) {
    local_70 = (pointer)local_30;
    local_68 = attributes.data_;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              (&local_60,_local_30);
    local_80 = ParserBase::placeholderToken(&this->super_ParserBase);
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::emptyPortConnection
                           (&this->factory,&local_60,local_80);
  }
  else {
    bVar1 = ParserBase::peek(&this->super_ParserBase,DotStar);
    if (bVar1) {
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                (&local_b0,_local_30);
      TVar2 = ParserBase::consume(&this->super_ParserBase);
      this_local = (Parser *)
                   slang::syntax::SyntaxFactory::wildcardPortConnection
                             (&this->factory,&local_b0,TVar2);
    }
    else {
      bVar1 = ParserBase::peek(&this->super_ParserBase,Dot);
      if (bVar1) {
        TVar2 = ParserBase::consume(&this->super_ParserBase);
        name_00 = ParserBase::expect(&this->super_ParserBase,Identifier);
        openParen.info = (Info *)0x0;
        Token::Token((Token *)&closeParen.info);
        Token::Token((Token *)local_118);
        bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
        if (bVar1) {
          local_128 = ParserBase::consume(&this->super_ParserBase);
          closeParen.info = (Info *)local_128._0_8_;
          openParen._0_8_ = local_128.info;
          bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis);
          if (!bVar1) {
            openParen.info = (Info *)parsePropertyExpr(this,0);
          }
          TVar3 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
          local_138._0_8_ = TVar3._0_8_;
          local_118._0_2_ = local_138.kind;
          local_118[2] = local_138._2_1_;
          local_118[3] = local_138.numFlags.raw;
          local_118._4_4_ = local_138.rawLen;
          local_138.info = TVar3.info;
          closeParen._0_8_ = local_138.info;
          local_138 = TVar3;
        }
        local_180.info = (Info *)local_30;
        local_170 = attributes.data_;
        slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                  (&local_168,_local_30);
        name.info = TVar2._0_8_;
        local_190.info = name.info;
        dot._0_8_ = TVar2.info;
        local_180.kind = dot.kind;
        local_180._2_1_ = dot._2_1_;
        local_180.numFlags.raw = dot.numFlags.raw;
        local_180.rawLen = dot.rawLen;
        expr = name_00._0_8_;
        local_1a0.info = (Info *)expr;
        name._0_8_ = name_00.info;
        local_190.kind = name.kind;
        local_190._2_1_ = name._2_1_;
        local_190.numFlags.raw = name.numFlags.raw;
        local_190.rawLen = name.rawLen;
        local_1a8 = closeParen.info;
        local_1a0.kind = openParen.kind;
        local_1a0._2_1_ = openParen._2_1_;
        local_1a0.numFlags.raw = openParen.numFlags.raw;
        local_1a0.rawLen = openParen.rawLen;
        local_1b8._0_8_ = local_118;
        local_1b8._8_2_ = closeParen.kind;
        local_1b8[10] = closeParen._2_1_;
        local_1b8[0xb] = closeParen.numFlags.raw;
        local_1b8._12_4_ = closeParen.rawLen;
        openParen_00.info = (Info *)openParen._0_8_;
        openParen_00._0_8_ = closeParen.info;
        closeParen_00.info = (Info *)closeParen._0_8_;
        closeParen_00.kind = local_118._0_2_;
        closeParen_00._2_1_ = local_118[2];
        closeParen_00.numFlags.raw = local_118[3];
        closeParen_00.rawLen = local_118._4_4_;
        this_local = (Parser *)
                     slang::syntax::SyntaxFactory::namedPortConnection
                               (&this->factory,&local_168,TVar2,name_00,openParen_00,
                                (PropertyExprSyntax *)openParen.info,closeParen_00);
      }
      else {
        slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                  (&local_1e8,_local_30);
        expr_00 = parsePropertyExpr(this,0);
        this_local = (Parser *)
                     slang::syntax::SyntaxFactory::orderedPortConnection
                               (&this->factory,&local_1e8,expr_00);
      }
    }
  }
  return (PortConnectionSyntax *)this_local;
}

Assistant:

PortConnectionSyntax& Parser::parsePortConnection() {
    auto attributes = parseAttributes();

    // Allow for empty port connections.
    if (peek(TokenKind::Comma) || peek(TokenKind::CloseParenthesis))
        return factory.emptyPortConnection(attributes, placeholderToken());

    if (peek(TokenKind::DotStar))
        return factory.wildcardPortConnection(attributes, consume());

    if (peek(TokenKind::Dot)) {
        auto dot = consume();
        auto name = expect(TokenKind::Identifier);

        PropertyExprSyntax* expr = nullptr;
        Token openParen, closeParen;

        if (peek(TokenKind::OpenParenthesis)) {
            openParen = consume();
            if (!peek(TokenKind::CloseParenthesis))
                expr = &parsePropertyExpr(0);

            closeParen = expect(TokenKind::CloseParenthesis);
        }
        return factory.namedPortConnection(attributes, dot, name, openParen, expr, closeParen);
    }
    return factory.orderedPortConnection(attributes, parsePropertyExpr(0));
}